

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SaturationAlgorithm.cpp
# Opt level: O0

void __thiscall Saturation::SaturationAlgorithm::doUnprocessedLoop(SaturationAlgorithm *this)

{
  bool bVar1;
  Clause *in_RDI;
  SaturationAlgorithm *unaff_retaddr;
  Clause *c;
  Clause *in_stack_000000b0;
  SaturationAlgorithm *in_stack_000000b8;
  SaturationAlgorithm *in_stack_fffffffffffffff0;
  
  do {
    newClausesToUnprocessed(unaff_retaddr);
    while( true ) {
      bVar1 = UnprocessedClauseContainer::isEmpty((UnprocessedClauseContainer *)0xad1c18);
      if (((bVar1 ^ 0xffU) & 1) == 0) break;
      in_stack_fffffffffffffff0 =
           (SaturationAlgorithm *)
           UnprocessedClauseContainer::pop((UnprocessedClauseContainer *)in_stack_fffffffffffffff0);
      (**(code **)(*(long *)&in_RDI->super_Unit + 0x70))(in_RDI,in_stack_fffffffffffffff0);
      bVar1 = forwardSimplify(in_stack_000000b8,in_stack_000000b0);
      if (bVar1) {
        (**(code **)(*(long *)&in_RDI->super_Unit + 0x58))(in_RDI,in_stack_fffffffffffffff0);
        addToPassive(in_stack_fffffffffffffff0,in_RDI);
      }
      else {
        Kernel::Clause::setStore((Clause *)in_stack_fffffffffffffff0,(Store)((ulong)in_RDI >> 0x20))
        ;
      }
      newClausesToUnprocessed(unaff_retaddr);
    }
    onAllProcessed(in_stack_fffffffffffffff0);
    bVar1 = clausesFlushed(in_stack_fffffffffffffff0);
  } while (((bVar1 ^ 0xffU) & 1) != 0);
  return;
}

Assistant:

void SaturationAlgorithm::doUnprocessedLoop()
{
  do {
    newClausesToUnprocessed();

    while (!_unprocessed->isEmpty()) {
      Clause* c = _unprocessed->pop();
      poppedFromUnprocessed(c); // tells LRS's it might make sense to update limits

      ASS(!isRefutation(c));

      if (forwardSimplify(c)) {
        onClauseRetained(c);
        addToPassive(c);
        ASS_EQ(c->store(), Clause::PASSIVE);
      }
      else {
        ASS_EQ(c->store(), Clause::UNPROCESSED);
        c->setStore(Clause::NONE);
      }

      newClausesToUnprocessed();
    }

    ASS(clausesFlushed());
    onAllProcessed(); // in particular, Splitter has now recomputed model which may have triggered deletions and additions
  } while (!clausesFlushed());
}